

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O2

void __thiscall CSocekt::msgSend(CSocekt *this,char *psendbuf)

{
  int iVar1;
  SourceFile file;
  MutexLockGuard lock;
  char *psendbuf_local;
  undefined1 local_ff8 [12];
  Logger local_fe8;
  
  lock.mutex_ = &this->m_sendMessageQueueMutex;
  psendbuf_local = psendbuf;
  muduo::MutexLock::lock(lock.mutex_);
  std::__cxx11::list<char_*,_std::allocator<char_*>_>::push_back
            (&this->m_MsgSendQueue,&psendbuf_local);
  LOCK();
  (this->m_iSendMsgQueueCount).value_ = (this->m_iSendMsgQueueCount).value_ + 1;
  UNLOCK();
  iVar1 = sem_post((sem_t *)&this->m_semEventSendQueue);
  if (iVar1 == -1) {
    muduo::Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_ff8,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
              );
    file._12_4_ = 0;
    file.data_ = (char *)local_ff8._0_8_;
    file.size_ = local_ff8._8_4_;
    muduo::Logger::Logger(&local_fe8,file,0x151,ERROR);
    muduo::LogStream::operator<<(&local_fe8.impl_.stream_,anon_var_dwarf_18891);
    muduo::Logger::~Logger(&local_fe8);
  }
  muduo::MutexLockGuard::~MutexLockGuard(&lock);
  return;
}

Assistant:

void CSocekt::msgSend(char *psendbuf) 
{
    muduo::MutexLockGuard lock(m_sendMessageQueueMutex);
    m_MsgSendQueue.push_back(psendbuf);    
    m_iSendMsgQueueCount.increment();   //原子操作

    //将信号量的值+1,这样其他卡在sem_wait的就可以走下去
    if(sem_post(&m_semEventSendQueue)==-1)  //让ServerSendQueueThread()流程走下来干活
    {
        LOG_ERROR << "CSocekt::msgSend()中sem_post(&m_semEventSendQueue)失败.";
   
    }
    return;
}